

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

CURLcode Curl_h1_req_write_head(httpreq *req,int http_minor,dynbuf *dbuf)

{
  char *pcVar1;
  char *local_68;
  char *local_58;
  char *local_40;
  CURLcode local_24;
  CURLcode result;
  dynbuf *dbuf_local;
  int http_minor_local;
  httpreq *req_local;
  
  if (req->scheme == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = req->scheme;
  }
  pcVar1 = "";
  if (req->scheme != (char *)0x0) {
    pcVar1 = "://";
  }
  if (req->authority == (char *)0x0) {
    local_58 = "";
  }
  else {
    local_58 = req->authority;
  }
  if (req->path == (char *)0x0) {
    local_68 = "";
  }
  else {
    local_68 = req->path;
  }
  local_24 = Curl_dyn_addf(dbuf,"%s %s%s%s%s HTTP/1.%d\r\n",req,local_40,pcVar1,local_58,local_68,
                           http_minor);
  if ((local_24 == CURLE_OK) &&
     (local_24 = Curl_dynhds_h1_dprint(&req->headers,dbuf), local_24 == CURLE_OK)) {
    local_24 = Curl_dyn_addn(dbuf,"\r\n",2);
  }
  return local_24;
}

Assistant:

CURLcode Curl_h1_req_write_head(struct httpreq *req, int http_minor,
                                struct dynbuf *dbuf)
{
  CURLcode result;

  result = Curl_dyn_addf(dbuf, "%s %s%s%s%s HTTP/1.%d\r\n",
                         req->method,
                         req->scheme ? req->scheme : "",
                         req->scheme ? "://" : "",
                         req->authority ? req->authority : "",
                         req->path ? req->path : "",
                         http_minor);
  if(result)
    goto out;

  result = Curl_dynhds_h1_dprint(&req->headers, dbuf);
  if(result)
    goto out;

  result = Curl_dyn_addn(dbuf, STRCONST("\r\n"));

out:
  return result;
}